

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3s.hpp
# Opt level: O3

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::mrg3s>::addin(mrg3s *r)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  iVar1 = (r->S).r[0];
  iVar2 = (r->S).r[1];
  uVar3 = (long)(r->S).r[2] * (long)(r->P).a[2] +
          (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar1;
  (r->S).r[2] = iVar2;
  (r->S).r[1] = iVar1;
  uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
  uVar3 = (uVar3 >> 0x1f) * -0x7fffadb3 + uVar3;
  iVar1 = (int)uVar3;
  iVar2 = iVar1 + -0x7fffadb3;
  if (uVar3 < 0x7fffadb3) {
    iVar2 = iVar1;
  }
  (r->S).r[0] = iVar2;
  return (double)iVar2;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg3s::step() {
    const uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
                     static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
                     static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2])};
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 3>(t);
  }